

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_SelectSortInc(word *pData,int nSize)

{
  word wVar1;
  word t;
  int best_i;
  int j;
  int i;
  int nSize_local;
  word *pData_local;
  
  for (best_i = 0; best_i < nSize + -1; best_i = best_i + 1) {
    t._0_4_ = best_i;
    t._4_4_ = best_i;
    while (t._4_4_ = t._4_4_ + 1, t._4_4_ < nSize) {
      if ((uint)pData[t._4_4_] < (uint)pData[(int)t]) {
        t._0_4_ = t._4_4_;
      }
    }
    wVar1 = pData[best_i];
    pData[best_i] = pData[(int)t];
    pData[(int)t] = wVar1;
  }
  return;
}

Assistant:

static inline void Abc_SelectSortInc( word * pData, int nSize )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( (unsigned)pData[j] < (unsigned)pData[best_i] )
                best_i = j;
        ABC_SWAP( word, pData[i], pData[best_i] );
    }
}